

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O0

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::readVariable
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this,Mapping *m,string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference_wrapper<const_yaml::Value> *this_00;
  Value *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_50 [8];
  ExpectedRef<const_Value,_std::string> value_result;
  string *name_local;
  Mapping *m_local;
  Loader *this_local;
  
  value_result._32_8_ = name;
  yaml::Mapping::getValue((ExpectedRef<const_Value,_std::string> *)local_50,m,name);
  bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_50);
  if (bVar1) {
    this_00 = Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_50);
    this_01 = std::reference_wrapper<const_yaml::Value>::get(this_00);
    yaml::Value::getInt_abi_cxx11_(__return_storage_ptr__,this_01);
  }
  else {
    std::operator+(&local_e0,"Cannot read variable ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   value_result._32_8_);
    std::operator+(&local_c0,&local_e0,": ");
    __rhs = Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error((Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50);
    std::operator+(&local_a0,&local_c0,__rhs);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_80,&local_a0);
    Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_80);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> readVariable(const yaml::Mapping &m, const std::string &name) {
		auto value_result = m.getValue(name);
		if (!value_result)
			return Unexpected("Cannot read variable " + name + ": " + value_result.error());
		// FIXME read actual variable
		return value_result.value().get().getInt();
	}